

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_enumerator.cpp
# Opt level: O3

void __thiscall duckdb::PlanEnumerator::GenerateCrossProducts(PlanEnumerator *this)

{
  JoinRelationSet *right;
  iterator iVar1;
  JoinRelationSet *right_00;
  ulong uVar2;
  QueryGraphManager *pQVar3;
  QueryGraphEdges *this_00;
  idx_t index;
  idx_t index_00;
  idx_t local_40;
  JoinRelationSet *local_38;
  
  pQVar3 = this->query_graph_manager;
  if ((pQVar3->relation_manager).relations.
      super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pQVar3->relation_manager).relations.
      super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    index_00 = 0;
    do {
      local_38 = JoinRelationSetManager::GetJoinRelation(&pQVar3->set_manager,index_00);
      pQVar3 = this->query_graph_manager;
      if ((pQVar3->relation_manager).relations.
          super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (pQVar3->relation_manager).relations.
          super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        return;
      }
      index = 0;
      do {
        local_40 = index_00;
        iVar1 = ::std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(pQVar3->relation_manager).no_cross_product_relations._M_h,&local_40);
        if (((iVar1.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) &&
            (local_40 = index,
            iVar1 = ::std::
                    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&(this->query_graph_manager->relation_manager).no_cross_product_relations
                            ._M_h,&local_40), index_00 != index)) &&
           (iVar1.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0)) {
          right_00 = JoinRelationSetManager::GetJoinRelation
                               (&this->query_graph_manager->set_manager,index);
          right = local_38;
          this_00 = &this->query_graph_manager->query_graph;
          QueryGraphEdges::CreateEdge
                    (this_00,local_38,right_00,(optional_ptr<duckdb::FilterInfo,_true>)0x0);
          QueryGraphEdges::CreateEdge
                    (this_00,right_00,right,(optional_ptr<duckdb::FilterInfo,_true>)0x0);
        }
        index = index + 1;
        pQVar3 = this->query_graph_manager;
        uVar2 = (long)(pQVar3->relation_manager).relations.
                      super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pQVar3->relation_manager).relations.
                      super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3;
      } while (index < uVar2);
      index_00 = index_00 + 1;
    } while (index_00 < uVar2);
  }
  return;
}

Assistant:

void PlanEnumerator::GenerateCrossProducts() {
	// generate a set of cross products to combine the currently available plans into a full join plan
	// we create edges between every relation with a high cost
	for (idx_t i = 0; i < query_graph_manager.relation_manager.NumRelations(); i++) {
		auto &left = query_graph_manager.set_manager.GetJoinRelation(i);
		for (idx_t j = 0; j < query_graph_manager.relation_manager.NumRelations(); j++) {
			auto cross_product_allowed = query_graph_manager.relation_manager.CrossProductWithRelationAllowed(i) &&
			                             query_graph_manager.relation_manager.CrossProductWithRelationAllowed(j);
			if (i != j && cross_product_allowed) {
				auto &right = query_graph_manager.set_manager.GetJoinRelation(j);
				query_graph_manager.CreateQueryGraphCrossProduct(left, right);
			}
		}
	}
	// Now that the query graph has new edges, we need to re-initialize our query graph.
	// TODO: do we need to initialize our qyery graph again?
	// query_graph = query_graph_manager.GetQueryGraph();
}